

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ecf33::ClangShellCommand::processDiscoveredDependencies
          (ClangShellCommand *this,TaskInterface ti,QueueJobContext *context)

{
  bool bVar1;
  BuildSystemImpl *pBVar2;
  FileSystem *pFVar3;
  BuildSystemDelegate *pBVar4;
  undefined8 uVar5;
  pointer this_00;
  void *extraout_RDX;
  anon_unknown_dwarf_ecf33 *this_01;
  TaskInterface ti_00;
  TaskInterface ti_01;
  StringRef data;
  MakefileDepsParser local_118;
  anon_unknown_dwarf_ecf33 *local_f8;
  void *local_f0;
  undefined1 local_e8 [8];
  DepsActions actions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  anon_unknown_dwarf_ecf33 *local_68;
  void *local_60;
  anon_unknown_dwarf_ecf33 *local_58;
  void *local_50;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_48;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> input;
  QueueJobContext *context_local;
  ClangShellCommand *this_local;
  TaskInterface ti_local;
  
  ti_00.ctx = ti.ctx;
  this_01 = (anon_unknown_dwarf_ecf33 *)ti.impl;
  ti_00.impl = ti_00.ctx;
  local_58 = this_01;
  local_50 = ti_00.ctx;
  input._M_t.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       context;
  pBVar2 = getBuildSystem(this_01,ti_00);
  pFVar3 = BuildSystemImpl::getFileSystem(pBVar2);
  (*pFVar3->_vptr_FileSystem[4])(&local_48,pFVar3,&this->depsPath);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_48);
  if (bVar1) {
    local_f8 = this_01;
    local_f0 = ti_00.ctx;
    (anonymous_namespace)::ClangShellCommand::processDiscoveredDependencies(llbuild::core::
    TaskInterface,llbuild::basic::QueueJobContext*)::DepsActions::DepsActions(llbuild::core::
    TaskInterface,(anonymous)::ClangShellCommand__(local_e8,ti,this);
    this_00 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
              operator->(&local_48);
    data = llvm::MemoryBuffer::getBuffer(this_00);
    llbuild::core::MakefileDepsParser::MakefileDepsParser
              (&local_118,data,(ParseActions *)local_e8,false);
    llbuild::core::MakefileDepsParser::parse(&local_118);
    ti_local.ctx._7_1_ = (int)actions.command == 0;
    actions._36_4_ = 1;
    processDiscoveredDependencies::DepsActions::~DepsActions((DepsActions *)local_e8);
  }
  else {
    ti_01.ctx = extraout_RDX;
    ti_01.impl = ti_00.ctx;
    local_68 = this_01;
    local_60 = ti_00.ctx;
    pBVar2 = getBuildSystem(this_01,ti_01);
    pBVar4 = BuildSystemImpl::getDelegate(pBVar2);
    std::operator+(&local_b8,"unable to open dependencies file (",&this->depsPath);
    std::operator+(&local_98,&local_b8,")");
    local_78 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::length();
    (*pBVar4->_vptr_BuildSystemDelegate[0xb])(pBVar4,this,local_78,uVar5);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    ti_local.ctx._7_1_ = false;
    actions._36_4_ = 1;
  }
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (&local_48);
  return ti_local.ctx._7_1_;
}

Assistant:

bool processDiscoveredDependencies(TaskInterface ti,
                                     QueueJobContext* context) {
    // Read the dependencies file.
    auto input = getBuildSystem(ti).getFileSystem().getFileContents(depsPath);
    if (!input) {
      getBuildSystem(ti).getDelegate().commandHadError(this,
                     "unable to open dependencies file (" + depsPath + ")");
      return false;
    }

    // Parse the output.
    //
    // We just ignore the rule, and add any dependency that we encounter in the
    // file.
    struct DepsActions : public core::MakefileDepsParser::ParseActions {
      TaskInterface ti;
      ClangShellCommand* command;
      unsigned numErrors{0};

      DepsActions(TaskInterface ti,
                  ClangShellCommand* command)
          : ti(ti), command(command) {}

      virtual void error(StringRef message, uint64_t position) override {
        getBuildSystem(ti).getDelegate().commandHadError(command,
                       "error reading dependency file '" + command->depsPath +
                       "': " + message.str());
        ++numErrors;
      }

      virtual void actOnRuleDependency(StringRef dependency,
                                       StringRef unescapedWord) override {
        ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
        getBuildSystem(ti).getDelegate().commandFoundDiscoveredDependency(command, unescapedWord,
                                                                          DiscoveredDependencyKind::Input);
      }

      virtual void actOnRuleStart(StringRef name,
                                  StringRef unescapedWord) override {}

      virtual void actOnRuleEnd() override {}
    };

    DepsActions actions(ti, this);
    core::MakefileDepsParser(input->getBuffer(), actions, false).parse();
    return actions.numErrors == 0;
  }